

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

word If_Dec5Perform(word t,int fDerive)

{
  word wVar1;
  word z;
  word t0;
  int local_60;
  int v;
  int j;
  int i;
  int Var2Pla [7];
  int Pla2Var [7];
  int fDerive_local;
  word t_local;
  
  for (v = 0; v < 7; v = v + 1) {
    (&j)[v] = v;
    Var2Pla[(long)v + 6] = v;
  }
  t0._4_4_ = 0;
  unique0x10000125 = t;
  do {
    if (4 < t0._4_4_) {
      return 0;
    }
    register0x00000000 = If_Dec6MoveTo(stack0xffffffffffffffe8,t0._4_4_,0,Var2Pla + 6,&j);
    If_DecVerifyPerm(Var2Pla + 6,&j);
    for (v = 0; local_60 = v, v < 4; v = v + 1) {
      while (local_60 = local_60 + 1, local_60 < 4) {
        wVar1 = If_Dec5CofCount2(register0x00000000,v,local_60,Var2Pla + 6,t,fDerive);
        if (wVar1 != 0) {
          return wVar1;
        }
      }
    }
    t0._4_4_ = t0._4_4_ + 1;
  } while( true );
}

Assistant:

word If_Dec5Perform( word t, int fDerive )
{
    int Pla2Var[7], Var2Pla[7];
    int i, j, v;
    word t0 = t;
/*
    word c0, c1, c00, c01, c10, c11;
    for ( i = 0; i < 5; i++ )
    {
        c0 = If_Dec6Cofactor( t, i, 0 );
        c1 = If_Dec6Cofactor( t, i, 1 );
        if ( c0 == 0 )
            return 1;
        if ( ~c0 == 0 )
            return 1;
        if ( c1 == 0 )
            return 1;
        if ( ~c1 == 0 )
            return 1;
       if ( c0 == ~c1 )
            return 1;
    }
    for ( i = 0; i < 4; i++ )
    {
        c0 = If_Dec6Cofactor( t, i, 0 );
        c1 = If_Dec6Cofactor( t, i, 1 );
        for ( j = i + 1; j < 5; j++ )
        {
            c00 = If_Dec6Cofactor( c0, j, 0 );
            c01 = If_Dec6Cofactor( c0, j, 1 );
            c10 = If_Dec6Cofactor( c1, j, 0 );
            c11 = If_Dec6Cofactor( c1, j, 1 );
            if ( c00 == c01 && c00 == c10 )
                return 1;
            if ( c11 == c01 && c11 == c10 )
                return 1;
            if ( c11 == c00 && c11 == c01 )
                return 1;
            if ( c11 == c00 && c11 == c10 )
                return 1;
            if ( c00 == c11 && c01 == c10 )
                return 1;
        }
    }
*/
    // start arrays
    for ( i = 0; i < 7; i++ )
        Pla2Var[i] = Var2Pla[i] = i;
    // generate permutations
    for ( v = 0; v < 5; v++ )
    {
        t = If_Dec6MoveTo( t, v, 0, Pla2Var, Var2Pla );
        If_DecVerifyPerm( Pla2Var, Var2Pla );
        for ( i = 0; i < 4; i++ )
            for ( j = i + 1; j < 4; j++ )
            {
                word z = If_Dec5CofCount2( t, i, j, Pla2Var, t0, fDerive );
                if ( z )
                {
/*
                    if ( v == 0 && i == 1 && j == 2 )
                    {
                          Kit_DsdPrintFromTruth( (unsigned *)&t, 5 ); printf( "\n" );
                    }
*/
                    return z;
                }
            }
    }

/*
    // start arrays
    for ( i = 0; i < 7; i++ )
        Pla2Var[i] = Var2Pla[i] = i;

    t = t0;
    for ( v = 0; v < 5; v++ )
    {
        int x, y;

        t = If_Dec6MoveTo( t, v, 0, Pla2Var, Var2Pla );
        If_DecVerifyPerm( Pla2Var, Var2Pla );

        for ( i = 0; i < 16; i++ )
            printf( "%d ", ((t >> (i<<1)) & 3) );
        printf( "\n" );

        for ( x = 0; x < 4; x++ )
        for ( y = x + 1; y < 4; y++ )
        {
            for ( i = 0; i < 16; i++ )
                if ( !((i >> x) & 1) && !((i >> y) & 1) )
                    printf( "%d ", ((t >> (i<<1)) & 3) );
            printf( "\n" );

            for ( i = 0; i < 16; i++ )
                if ( ((i >> x) & 1) && !((i >> y) & 1) )
                    printf( "%d ", ((t >> (i<<1)) & 3) );
            printf( "\n" );

            for ( i = 0; i < 16; i++ )
                if ( !((i >> x) & 1) && ((i >> y) & 1) )
                    printf( "%d ", ((t >> (i<<1)) & 3) );
            printf( "\n" );

            for ( i = 0; i < 16; i++ )
                if ( ((i >> x) & 1) && ((i >> y) & 1) )
                    printf( "%d ", ((t >> (i<<1)) & 3) );
            printf( "\n" );
            printf( "\n" );
        }
    }
*/

//    Kit_DsdPrintFromTruth( (unsigned *)&t, 5 ); printf( "\n" );
    return 0;
}